

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O2

CloudManager * Cloud_Init(int nVars,int nBits)

{
  uint __line;
  CloudManager *dd;
  long lVar1;
  CloudNode *pCVar2;
  CloudNode **ppCVar3;
  byte bVar4;
  char *__assertion;
  int iVar5;
  int iVar6;
  
  if (nVars < 0x186a1) {
    if (nBits < 0x20) {
      iVar6 = 0x17;
      if (nBits != 0) {
        iVar6 = nBits;
      }
      dd = (CloudManager *)calloc(1,0x130);
      dd->nMemUsed = 0x130;
      dd->nVars = nVars;
      dd->bitsNode = iVar6;
      for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 4) {
        *(int *)((long)dd->bitsCache + lVar1) = iVar6 - *(int *)((long)CacheLogRatioDefault + lVar1)
        ;
      }
      dd->shiftUnique = 0x1f - iVar6;
      for (lVar1 = 2; lVar1 != 6; lVar1 = lVar1 + 1) {
        dd->bitsCache[lVar1 + 3] = 0x20 - dd->bitsCache[lVar1 + -2];
      }
      bVar4 = (byte)iVar6 + 1;
      iVar5 = 1 << (bVar4 & 0x1f);
      dd->nNodesAlloc = iVar5;
      dd->nNodesLimit = 1 << ((byte)iVar6 & 0x1f);
      Abc_Clock();
      pCVar2 = (CloudNode *)calloc((long)iVar5,0x18);
      dd->tUnique = pCVar2;
      iVar6 = dd->nMemUsed;
      Abc_Clock();
      dd->nSignCur = 1;
      pCVar2->s = 1;
      pCVar2->v = 0xfffffff;
      pCVar2->e = (CloudNode *)0x0;
      pCVar2->t = (CloudNode *)0x0;
      dd->one = pCVar2;
      dd->zero = (CloudNode *)((ulong)pCVar2 ^ 1);
      dd->nNodesCur = 1;
      dd->pNodeStart = pCVar2 + 1;
      dd->pNodeEnd = pCVar2 + iVar5;
      ppCVar3 = (CloudNode **)malloc((long)nVars << 3);
      dd->vars = ppCVar3;
      dd->nMemUsed = (0x18 << (bVar4 & 0x1f)) + iVar6 + nVars * 8;
      for (lVar1 = 0; lVar1 < nVars; lVar1 = lVar1 + 1) {
        pCVar2 = cloudMakeNode(dd,(CloudVar)lVar1,dd->one,dd->zero);
        dd->vars[lVar1] = pCVar2;
        nVars = dd->nVars;
      }
      return dd;
    }
    __assertion = "nBits < 32";
    __line = 0x4d;
  }
  else {
    __assertion = "nVars <= 100000";
    __line = 0x4c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                ,__line,"CloudManager *Cloud_Init(int, int)");
}

Assistant:

CloudManager * Cloud_Init( int nVars, int nBits )
{
	CloudManager * dd;
	int i;
	abctime clk1, clk2;

	assert( nVars <= 100000 );
	assert( nBits < 32 );

	// assign the defaults
	if ( nBits == 0 )
		nBits = CLOUD_NODE_BITS;

	// start the manager
	dd = ABC_CALLOC( CloudManager, 1 );
	dd->nMemUsed          += sizeof(CloudManager);

	// variables
	dd->nVars             = nVars;              // the number of variables allocated
	// bits
	dd->bitsNode          = nBits;              // the number of bits used for the node
	for ( i = 0; i < CacheOperNum; i++ )
		dd->bitsCache[i]  = nBits - CacheLogRatioDefault[i];
	// shifts
	dd->shiftUnique       = 8*sizeof(unsigned) - (nBits + 1); // gets node index in the hash table
	for ( i = 0; i < CacheOperNum; i++ )
		dd->shiftCache[i] = 8*sizeof(unsigned) - dd->bitsCache[i];
	// nodes
	dd->nNodesAlloc       = (1 << (nBits + 1)); // 2 ^ (nBits + 1)
	dd->nNodesLimit       = (1 << nBits);       // 2 ^  nBits

	// unique table
clk1 = Abc_Clock();
	dd->tUnique           = ABC_CALLOC( CloudNode, dd->nNodesAlloc );
	dd->nMemUsed         += sizeof(CloudNode) * dd->nNodesAlloc;
clk2 = Abc_Clock();
//ABC_PRT( "calloc() time", clk2 - clk1 ); 

	// set up the constant node (the only node that is not in the hash table)
	dd->nSignCur          = 1;
	dd->tUnique[0].s      = dd->nSignCur;
	dd->tUnique[0].v      = CLOUD_CONST_INDEX;
	dd->tUnique[0].e      = NULL;
	dd->tUnique[0].t      = NULL;
	dd->one               = dd->tUnique;
	dd->zero              = Cloud_Not(dd->one);
	dd->nNodesCur         = 1;

	// special nodes
	dd->pNodeStart        = dd->tUnique + 1;
	dd->pNodeEnd          = dd->tUnique + dd->nNodesAlloc;

	// set up the elementary variables
	dd->vars              = ABC_ALLOC( CloudNode *, dd->nVars );
	dd->nMemUsed         += sizeof(CloudNode *) * dd->nVars;
	for ( i = 0; i < dd->nVars; i++ )
		dd->vars[i]   = cloudMakeNode( dd, i, dd->one, dd->zero );

	return dd;
}